

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.cc
# Opt level: O1

bool __thiscall ipx::SparseMatrix::IsSorted(SparseMatrix *this)

{
  long lVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  
  piVar3 = (this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (int)((ulong)((long)(this->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar3) >> 2) - 1;
  bVar11 = (int)uVar7 < 1;
  if (0 < (int)uVar7) {
    piVar4 = (this->rowidx_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      iVar2 = piVar3[uVar8];
      iVar9 = (int)((long)piVar3[uVar8 + 1] + -1);
      if (iVar9 < iVar2) {
        iVar9 = iVar2;
      }
      lVar10 = (long)iVar2 + -1;
      do {
        if (lVar10 - iVar9 == -1) goto LAB_003b4c5a;
        lVar5 = lVar10 + 1;
        lVar1 = lVar10 + 1;
        lVar6 = lVar10 + 2;
        lVar10 = lVar1;
      } while (piVar4[lVar5] <= piVar4[lVar6]);
      if (lVar1 < (long)piVar3[uVar8 + 1] + -1) {
        return bVar11;
      }
LAB_003b4c5a:
      uVar8 = uVar8 + 1;
      bVar11 = uVar7 <= uVar8;
    } while (uVar8 != uVar7);
  }
  return bVar11;
}

Assistant:

bool SparseMatrix::IsSorted() const {
    for (Int j = 0; j < cols(); j++) {
        for (Int p = begin(j); p < end(j)-1; p++)
            if (index(p) > index(p+1))
                return false;
    }
    return true;
}